

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helicsCLI11.hpp
# Opt level: O0

void __thiscall helics::helicsCLI11App::remove_helics_specifics(helicsCLI11App *this)

{
  App *this_00;
  char *in_RDI;
  Error *anon_var_0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe80;
  allocator<char> *in_stack_fffffffffffffeb0;
  allocator<char> *__a;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_01;
  string *in_stack_fffffffffffffec8;
  App *in_stack_fffffffffffffed0;
  string *in_stack_fffffffffffffed8;
  App *in_stack_fffffffffffffee0;
  App *in_stack_fffffffffffffee8;
  allocator<char> local_101;
  undefined7 in_stack_ffffffffffffff00;
  undefined1 in_stack_ffffffffffffff07;
  App *in_stack_ffffffffffffff08;
  string *in_stack_ffffffffffffff10;
  string *in_stack_ffffffffffffff18;
  App *in_stack_ffffffffffffff20;
  allocator<char> local_b1 [40];
  allocator<char> local_89 [40];
  allocator<char> local_61 [56];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_29;
  
  this_01 = &local_29;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(this_01,in_RDI,in_stack_fffffffffffffeb0);
  __a = local_61;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(this_01,in_RDI,__a);
  CLI::App::set_help_flag(in_stack_fffffffffffffed0,in_stack_fffffffffffffec8,this_01);
  std::__cxx11::string::~string(in_stack_fffffffffffffe80);
  std::allocator<char>::~allocator((allocator<char> *)local_61);
  std::__cxx11::string::~string(in_stack_fffffffffffffe80);
  std::allocator<char>::~allocator((allocator<char> *)&local_29);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(this_01,in_RDI,__a);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(this_01,in_RDI,__a);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(this_01,in_RDI,__a);
  CLI::App::set_config
            (in_stack_ffffffffffffff20,in_stack_ffffffffffffff18,in_stack_ffffffffffffff10,
             (string *)in_stack_ffffffffffffff08,(bool)in_stack_ffffffffffffff07);
  std::__cxx11::string::~string(in_stack_fffffffffffffe80);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff27);
  std::__cxx11::string::~string(in_stack_fffffffffffffe80);
  std::allocator<char>::~allocator(local_b1);
  std::__cxx11::string::~string(in_stack_fffffffffffffe80);
  std::allocator<char>::~allocator(local_89);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(this_01,in_RDI,__a);
  CLI::App::get_option_no_throw
            (in_stack_ffffffffffffff08,
             (string *)CONCAT17(in_stack_ffffffffffffff07,in_stack_ffffffffffffff00));
  CLI::App::remove_option(in_stack_fffffffffffffee8,(Option *)in_stack_fffffffffffffee0);
  std::__cxx11::string::~string(in_stack_fffffffffffffe80);
  std::allocator<char>::~allocator(&local_101);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(this_01,in_RDI,__a);
  this_00 = CLI::App::get_option_group(in_stack_fffffffffffffee0,in_stack_fffffffffffffed8);
  CLI::App::remove_subcommand(in_stack_fffffffffffffee8,in_stack_fffffffffffffee0);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffed7);
  return;
}

Assistant:

void remove_helics_specifics()
    {
        set_help_flag();
        set_config();
        try {
            remove_option(get_option_no_throw("-v"));
            remove_subcommand(get_option_group("quiet"));
        }
        catch (const CLI::Error&) {
            // must have been removed earlier
        }
    }